

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# creadhb.c
# Opt level: O3

void creadhb(FILE *fp,int *nrow,int *ncol,int_t *nonz,singlecomplex **nzval,int_t **rowind,
            int_t **colptr)

{
  singlecomplex *z;
  long lVar1;
  int_t *__s;
  int_t *addr;
  long lVar2;
  ulong uVar3;
  int_t *piVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  int_t *addr_00;
  int iVar9;
  int *addr_01;
  int iVar10;
  int iVar11;
  uint uVar12;
  double dVar13;
  int tmp;
  int valsize;
  int valnum;
  int rowsize;
  int rownum;
  int colsize;
  int colnum;
  char type [4];
  char buf [100];
  char msg [256];
  int local_224;
  singlecomplex **local_220;
  int_t **local_218;
  int_t *local_210;
  singlecomplex *local_208;
  int_t *local_200;
  void *local_1f8;
  singlecomplex *local_1f0;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  undefined1 local_1cc;
  byte local_1cb;
  undefined1 local_1c9;
  int_t *local_1c8;
  ulong local_1c0;
  long local_1b8;
  int *local_1b0;
  char local_1a8 [14];
  undefined1 local_19a;
  char local_138 [264];
  
  local_220 = nzval;
  local_218 = rowind;
  fgets(local_1a8,100,(FILE *)fp);
  fputs(local_1a8,_stdout);
  iVar9 = 5;
  iVar10 = 0;
  iVar5 = 0;
  do {
    __isoc99_fscanf(fp,"%14c",local_1a8);
    local_19a = 0;
    __isoc99_sscanf(local_1a8,"%d",&local_224);
    if (iVar9 == 2) {
      iVar5 = local_224;
    }
    iVar11 = local_224;
    if (local_224 == 0) {
      iVar11 = iVar10;
    }
    if (iVar9 != 1) {
      iVar11 = iVar10;
    }
    iVar10 = iVar11;
    iVar9 = iVar9 + -1;
  } while (iVar9 != 0);
  do {
    iVar9 = fgetc((FILE *)fp);
  } while (iVar9 != 10);
  __isoc99_fscanf(fp,"%3c",&local_1cc);
  __isoc99_fscanf(fp,"%11c",local_1a8);
  local_1c9 = 0;
  __isoc99_fscanf(fp,"%14c",local_1a8);
  iVar9 = atoi(local_1a8);
  *nrow = iVar9;
  __isoc99_fscanf(fp,"%14c",local_1a8);
  iVar9 = atoi(local_1a8);
  *ncol = iVar9;
  __isoc99_fscanf(fp,"%14c",local_1a8);
  iVar9 = atoi(local_1a8);
  *nonz = iVar9;
  __isoc99_fscanf(fp,"%14c",local_1a8);
  local_224 = atoi(local_1a8);
  if (local_224 != 0) {
    puts("This is not an assembled matrix!");
  }
  if (*nrow != *ncol) {
    puts("Matrix is not square.");
  }
  do {
    iVar9 = fgetc((FILE *)fp);
  } while (iVar9 != 10);
  callocateA(*ncol,*nonz,local_220,local_218,colptr);
  __isoc99_fscanf(fp,"%16c",local_1a8);
  cParseIntFormat(local_1a8,&local_1d0,&local_1d4);
  __isoc99_fscanf(fp,"%16c",local_1a8);
  cParseIntFormat(local_1a8,&local_1d8,&local_1dc);
  __isoc99_fscanf(fp,"%20c",local_1a8);
  cParseFloatFormat(local_1a8,&local_1e0,&local_1e4);
  __isoc99_fscanf(fp,"%20c",local_1a8);
  do {
    iVar9 = fgetc((FILE *)fp);
  } while (iVar9 != 10);
  if (iVar10 != 0) {
    do {
      iVar9 = fgetc((FILE *)fp);
    } while (iVar9 != 10);
  }
  ReadVector(fp,*ncol + 1,*colptr,local_1d0,local_1d4);
  ReadVector(fp,*nonz,*local_218,local_1d8,local_1dc);
  if (iVar5 != 0) {
    cReadValues(fp,*nonz,*local_220,local_1e0,local_1e4);
  }
  if ((local_1cb & 0xdf) == 0x53) {
    uVar12 = *ncol;
    uVar7 = (ulong)uVar12;
    piVar4 = *local_218;
    addr_01 = *colptr;
    local_208 = *local_220;
    iVar5 = uVar12 + 1;
    __s = intMalloc(iVar5);
    if (__s == (int_t *)0x0) {
      sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for marker[]",0xd5,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/creadhb.c");
      superlu_abort_and_exit(local_138);
    }
    local_210 = intMalloc(iVar5);
    if (local_210 == (int_t *)0x0) {
      sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC t_colptr[]",0xd7,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/creadhb.c");
      superlu_abort_and_exit(local_138);
    }
    addr = intMalloc(*nonz);
    if (addr == (int_t *)0x0) {
      sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for t_rowind[]",0xd9,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/creadhb.c");
      superlu_abort_and_exit(local_138);
    }
    local_1f8 = superlu_malloc((long)*nonz << 3);
    if (local_1f8 == (void *)0x0) {
      sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for t_val[]",0xdb,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/creadhb.c");
      superlu_abort_and_exit(local_138);
    }
    if ((int)uVar12 < 1) {
      *local_210 = 0;
    }
    else {
      uVar6 = 0;
      memset(__s,0,uVar7 * 4);
      iVar9 = *addr_01;
      do {
        lVar2 = uVar6 + 1;
        uVar6 = uVar6 + 1;
        iVar10 = addr_01[lVar2];
        if (iVar9 < addr_01[lVar2]) {
          lVar2 = (long)iVar9;
          do {
            __s[piVar4[lVar2]] = __s[piVar4[lVar2]] + 1;
            lVar2 = lVar2 + 1;
            iVar10 = addr_01[uVar6];
          } while (lVar2 < addr_01[uVar6]);
        }
        iVar9 = iVar10;
      } while (uVar6 != uVar7);
      *local_210 = 0;
      uVar6 = 0;
      do {
        local_210[uVar6 + 1] = __s[uVar6] + local_210[uVar6];
        __s[uVar6] = local_210[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar7 != uVar6);
      iVar9 = *addr_01;
      uVar6 = 0;
      do {
        uVar3 = uVar6 + 1;
        iVar10 = addr_01[uVar6 + 1];
        if (iVar9 < addr_01[uVar6 + 1]) {
          lVar2 = (long)iVar9;
          do {
            iVar9 = piVar4[lVar2];
            addr[__s[iVar9]] = (int_t)uVar6;
            *(singlecomplex *)((long)local_1f8 + (long)__s[iVar9] * 8) = local_208[lVar2];
            __s[iVar9] = __s[iVar9] + 1;
            lVar2 = lVar2 + 1;
            iVar10 = addr_01[uVar3];
          } while (lVar2 < addr_01[uVar3]);
        }
        iVar9 = iVar10;
        uVar6 = uVar3;
      } while (uVar3 != uVar7);
    }
    lVar2 = (long)*nonz * 2 - (long)(int)uVar12;
    local_200 = intMalloc(iVar5);
    if (local_200 == (int_t *)0x0) {
      sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC a_colptr[]",0xf4,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/creadhb.c");
      superlu_abort_and_exit(local_138);
    }
    local_1c8 = piVar4;
    piVar4 = intMalloc((int_t)lVar2);
    if (piVar4 == (int_t *)0x0) {
      sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for a_rowind[]",0xf6,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/creadhb.c");
      superlu_abort_and_exit(local_138);
    }
    local_1b8 = lVar2;
    local_1f0 = (singlecomplex *)superlu_malloc(lVar2 * 8);
    if (local_1f0 == (singlecomplex *)0x0) {
      sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for a_val[]",0xf8,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/creadhb.c");
      superlu_abort_and_exit(local_138);
    }
    *local_200 = 0;
    addr_00 = local_210;
    if (0 < (int)uVar12) {
      uVar12 = 0;
      uVar6 = 0;
      local_1c0 = uVar7;
      local_1b0 = addr_01;
      do {
        lVar2 = (long)addr_00[uVar6];
        uVar7 = uVar6 + 1;
        iVar5 = addr_00[uVar6 + 1];
        if (addr_00[uVar6] < iVar5) {
          do {
            if (uVar6 != (uint)addr[lVar2]) {
              piVar4[(int)uVar12] = addr[lVar2];
              z = local_1f0 + (int)uVar12;
              local_1f0[(int)uVar12] = *(singlecomplex *)((long)local_1f8 + lVar2 * 8);
              dVar13 = c_abs1(z);
              if (dVar13 < 4.047e-300) {
                printf("%5d: %e\t%e\n",(double)z->r,(double)z->i,(ulong)uVar12);
              }
              uVar12 = uVar12 + 1;
              iVar5 = local_210[uVar7];
              addr_00 = local_210;
            }
            lVar2 = lVar2 + 1;
          } while (lVar2 < iVar5);
        }
        lVar2 = (long)local_1b0[uVar6];
        if (local_1b0[uVar6] < local_1b0[uVar7]) {
          lVar8 = 0;
          do {
            piVar4[(int)uVar12 + lVar8] = local_1c8[lVar2 + lVar8];
            local_1f0[(int)uVar12 + lVar8] = local_208[lVar2 + lVar8];
            lVar1 = lVar2 + lVar8;
            lVar8 = lVar8 + 1;
          } while (lVar1 + 1 < (long)local_1b0[uVar7]);
          uVar12 = uVar12 + (int)lVar8;
        }
        local_200[uVar7] = uVar12;
        addr_01 = local_1b0;
        uVar6 = uVar7;
      } while (uVar7 != local_1c0);
    }
    lVar2 = local_1b8;
    printf("FormFullA: new_nnz = %lld\n",local_1b8);
    superlu_free(local_208);
    superlu_free(local_1c8);
    superlu_free(addr_01);
    superlu_free(__s);
    superlu_free(local_1f8);
    superlu_free(addr);
    superlu_free(addr_00);
    *local_220 = local_1f0;
    *local_218 = piVar4;
    *colptr = local_200;
    *nonz = (int_t)lVar2;
  }
  fclose((FILE *)fp);
  return;
}

Assistant:

void
creadhb(FILE *fp, int *nrow, int *ncol, int_t *nonz,
	singlecomplex **nzval, int_t **rowind, int_t **colptr)
{

    register int i, numer_lines = 0, rhscrd = 0;
    int tmp, colnum, colsize, rownum, rowsize, valnum, valsize;
    char buf[100], type[4];
    int sym;

    /* Line 1 */
    fgets(buf, 100, fp);
    fputs(buf, stdout);

    /* Line 2 */
    for (i=0; i<5; i++) {
	fscanf(fp, "%14c", buf); buf[14] = 0;
	sscanf(buf, "%d", &tmp);
	if (i == 3) numer_lines = tmp;
	if (i == 4 && tmp) rhscrd = tmp;
    }
    cDumpLine(fp);

    /* Line 3 */
    fscanf(fp, "%3c", type);
    fscanf(fp, "%11c", buf); /* pad */
    type[3] = 0;
#if ( DEBUGlevel>=1 )
    printf("Matrix type %s\n", type);
#endif
    
    fscanf(fp, "%14c", buf); *nrow = atoi(buf);
    fscanf(fp, "%14c", buf); *ncol = atoi(buf);
    fscanf(fp, "%14c", buf); *nonz = atoi(buf);
    fscanf(fp, "%14c", buf); tmp = atoi(buf);
    
    if (tmp != 0)
	  printf("This is not an assembled matrix!\n");
    if (*nrow != *ncol)
	printf("Matrix is not square.\n");
    cDumpLine(fp);

    /* Allocate storage for the three arrays ( nzval, rowind, colptr ) */
    callocateA(*ncol, *nonz, nzval, rowind, colptr);

    /* Line 4: format statement */
    fscanf(fp, "%16c", buf);
    cParseIntFormat(buf, &colnum, &colsize);
    fscanf(fp, "%16c", buf);
    cParseIntFormat(buf, &rownum, &rowsize);
    fscanf(fp, "%20c", buf);
    cParseFloatFormat(buf, &valnum, &valsize);
    fscanf(fp, "%20c", buf);
    cDumpLine(fp);

    /* Line 5: right-hand side */    
    if ( rhscrd ) cDumpLine(fp); /* skip RHSFMT */
    
#ifdef DEBUG
    printf("%d rows, %lld nonzeros\n", *nrow, (long long) *nonz);
    printf("colnum %d, colsize %d\n", colnum, colsize);
    printf("rownum %d, rowsize %d\n", rownum, rowsize);
    printf("valnum %d, valsize %d\n", valnum, valsize);
#endif
    
    ReadVector(fp, *ncol+1, *colptr, colnum, colsize);
    ReadVector(fp, *nonz, *rowind, rownum, rowsize);
    if ( numer_lines ) {
        cReadValues(fp, *nonz, *nzval, valnum, valsize);
    }
    
    sym = (type[1] == 'S' || type[1] == 's');
    if ( sym ) {
	FormFullA(*ncol, nonz, nzval, rowind, colptr);
    }

    fclose(fp);
}